

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SecretManager::RegisterSecretFunction
          (SecretManager *this,CreateSecretFunction *function,OnCreateConflict on_conflict)

{
  unique_lock<std::mutex> lck;
  unique_lock<std::mutex> local_b0;
  CreateSecretFunction local_a0;
  
  ::std::unique_lock<std::mutex>::unique_lock(&local_b0,&this->manager_lock);
  CreateSecretFunction::CreateSecretFunction(&local_a0,function);
  RegisterSecretFunctionInternal(this,&local_a0,on_conflict);
  CreateSecretFunction::~CreateSecretFunction(&local_a0);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_b0);
  return;
}

Assistant:

void SecretManager::RegisterSecretFunction(CreateSecretFunction function, OnCreateConflict on_conflict) {
	unique_lock<mutex> lck(manager_lock);
	RegisterSecretFunctionInternal(std::move(function), on_conflict);
}